

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O0

timeType __thiscall sjtu::timeType::operator+(timeType *this,int *time)

{
  int *in_RDX;
  int *in_RSI;
  timeType *in_RDI;
  timeType tVar1;
  int day_add;
  timeType *ret;
  int local_1c;
  
  timeType(in_RDI);
  in_RDI->minute = in_RSI[3] + *in_RDX;
  in_RDI->hour = in_RSI[2] + in_RDI->minute / 0x3c;
  in_RDI->minute = in_RDI->minute % 0x3c;
  local_1c = in_RDI->hour / 0x18;
  in_RDI->hour = in_RDI->hour % 0x18;
  in_RDI->day = in_RSI[1];
  in_RDI->month = *in_RSI;
  while (*(int *)(months + (long)in_RDI->month * 4) < local_1c + in_RDI->day) {
    local_1c = local_1c - ((*(int *)(months + (long)in_RDI->month * 4) - in_RDI->day) + 1);
    in_RDI->day = 1;
    in_RDI->month = in_RDI->month + 1;
  }
  tVar1.hour = local_1c + in_RDI->day;
  in_RDI->day = tVar1.hour;
  tVar1._0_8_ = in_RDI;
  tVar1.minute = 0;
  return tVar1;
}

Assistant:

timeType timeType::operator+(const int &time) const {
        	timeType ret;
                ret.minute = minute + time , ret.hour = hour + ret.minute / 60 , ret.minute %= 60;
                int day_add = ret.hour / 24;ret.hour %= 24;
                for (ret.day = day , ret.month = month;day_add + ret.day > months[ret.month];++ ret.month) day_add -= months[ret.month] - ret.day + 1 , ret.day = 1;
                ret.day += day_add;
        	return ret;
        }